

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Runner::~Runner(Runner *this)

{
  std::
  _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
  ::~_Rb_tree(&(this->m_testsAlreadyRun)._M_t);
  Ptr<Catch::IStreamingReporter>::~Ptr(&this->m_reporter);
  std::ofstream::~ofstream(&this->m_ofs);
  Ptr<Catch::Config>::~Ptr(&this->m_config);
  return;
}

Assistant:

Runner( Ptr<Config> const& config )
        :   m_config( config )
        {
            openStream();
            makeReporter();
        }